

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O2

void __thiscall cmMakefile::AddInstallGenerator(cmMakefile *this,cmInstallGenerator *g)

{
  cmInstallGenerator *local_8;
  
  if (g != (cmInstallGenerator *)0x0) {
    local_8 = g;
    std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::push_back
              (&this->InstallGenerators,&local_8);
  }
  return;
}

Assistant:

void AddInstallGenerator(cmInstallGenerator* g)
    { if(g) this->InstallGenerators.push_back(g); }